

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildtexture.cpp
# Opt level: O2

int __thiscall FTextureManager::CountBuildTiles(FTextureManager *this)

{
  FString FVar1;
  BYTE *pBVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *copyStr;
  long lVar6;
  FILE *__stream;
  FTextureManager *this_00;
  size_t sVar7;
  uint uVar8;
  FWadCollection *this_01;
  ulong __n;
  uint uVar9;
  bool bVar10;
  FString rffpath;
  char artfile [13];
  int local_50;
  BYTE *art;
  FString artpath;
  
  builtin_strncpy(artfile,"tilesXXX.art",0xd);
  local_50 = 0;
  iVar3 = FWadCollection::CheckNumForFullName(&Wads,"blood.pal",false,0);
  uVar9 = 0;
  if (-1 < iVar3) {
    iVar3 = FWadCollection::GetLumpFile(&Wads,iVar3);
    copyStr = FWadCollection::GetWadFullName(&Wads,iVar3);
    FString::FString(&rffpath,copyStr);
    lVar6 = FString::LastIndexOf(&rffpath,'/');
    if ((int)lVar6 < 0) {
      FString::operator+=(&rffpath,'/');
    }
    else {
      FString::Truncate(&rffpath,(ulong)((int)lVar6 + 1));
    }
    local_50 = 0;
    for (uVar9 = 0; uVar9 != 1000; uVar9 = uVar9 + 1) {
      artfile[5] = (byte)((uVar9 & 0xffff) / 100) | 0x30;
      artfile[6] = (byte)(((ushort)((uVar9 & 0xffff) / 10) & 0xff) % 10) | 0x30;
      artfile[7] = (char)((uVar9 & 0xffff) / 10) * -10 + '0' + (char)uVar9;
      FString::AttachToOther(&artpath,&rffpath);
      FString::operator+=(&artpath,artfile);
      __stream = fopen(artpath.Chars,"rb");
      if (__stream != (FILE *)0x0) {
        iVar3 = Q_filelength((FILE *)__stream);
        __n = (ulong)iVar3;
        this_00 = (FTextureManager *)operator_new__(__n);
        art = (BYTE *)this_00;
        sVar7 = fread(this_00,1,__n,__stream);
        pBVar2 = art;
        if ((sVar7 == __n) && (iVar3 = CountTiles(this_00,art), iVar3 != 0)) {
          TArray<unsigned_char_*,_unsigned_char_*>::Push(&this->BuildTileFiles,&art);
          local_50 = local_50 + iVar3;
        }
        else if (pBVar2 != (BYTE *)0x0) {
          operator_delete__(pBVar2);
        }
        fclose(__stream);
      }
      FString::~FString(&artpath);
      if (__stream == (FILE *)0x0) break;
    }
    FString::~FString(&rffpath);
  }
  iVar3 = 1000 - uVar9;
  uVar8 = uVar9 + 0x30;
  while( true ) {
    bVar10 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar10) {
      return local_50;
    }
    artfile[7] = (char)uVar8 + (char)((uVar9 & 0xffff) / 10) * -10;
    artfile[5] = (byte)((uVar9 & 0xffff) / 100) | 0x30;
    artfile[6] = (byte)(((ushort)((uVar9 & 0xffff) / 10) & 0xff) % 10) | 0x30;
    iVar4 = FWadCollection::CheckNumForFullName(&Wads,artfile,false,0);
    if (iVar4 < 0) break;
    iVar5 = FWadCollection::LumpLength(&Wads,iVar4);
    rffpath.Chars = (char *)operator_new__((long)iVar5);
    this_01 = &Wads;
    FWadCollection::ReadLump(&Wads,iVar4,rffpath.Chars);
    FVar1.Chars = rffpath.Chars;
    iVar4 = CountTiles((FTextureManager *)this_01,rffpath.Chars);
    if (iVar4 == 0) {
      if (FVar1.Chars != (char *)0x0) {
        operator_delete__(FVar1.Chars);
      }
    }
    else {
      TArray<unsigned_char_*,_unsigned_char_*>::Push(&this->BuildTileFiles,(uchar **)&rffpath);
      local_50 = local_50 + iVar4;
    }
    uVar8 = (uint)(byte)((char)uVar8 + 1);
    uVar9 = uVar9 + 1;
  }
  return local_50;
}

Assistant:

int FTextureManager::CountBuildTiles ()
{
	int numartfiles = 0;
	char artfile[] = "tilesXXX.art";
	int lumpnum;
	int numtiles;
	int totaltiles = 0;

	lumpnum = Wads.CheckNumForFullName ("blood.pal");
	if (lumpnum >= 0)
	{
		// Blood's tiles are external resources. (Why did they do it like that?)
		FString rffpath = Wads.GetWadFullName (Wads.GetLumpFile (lumpnum));
		int slashat = rffpath.LastIndexOf ('/');
		if (slashat >= 0)
		{
			rffpath.Truncate (slashat + 1);
		}
		else
		{
			rffpath += '/';
		}

		for (; numartfiles < 1000; numartfiles++)
		{
			artfile[5] = numartfiles / 100 + '0';
			artfile[6] = numartfiles / 10 % 10 + '0';
			artfile[7] = numartfiles % 10 + '0';

			FString artpath = rffpath;
			artpath += artfile;

			FILE *f = fopen (artpath, "rb");
			if (f == NULL)
			{
				break;
			}

			size_t len = Q_filelength (f);
			BYTE *art = new BYTE[len];
			if (fread (art, 1, len, f) != len || (numtiles = CountTiles(art)) == 0)
			{
				delete[] art;
			}
			else
			{
				BuildTileFiles.Push (art);
				totaltiles += numtiles;
			}
			fclose (f);
		}
	}

	for (; numartfiles < 1000; numartfiles++)
	{
		artfile[5] = numartfiles / 100 + '0';
		artfile[6] = numartfiles / 10 % 10 + '0';
		artfile[7] = numartfiles % 10 + '0';
		lumpnum = Wads.CheckNumForFullName (artfile);
		if (lumpnum < 0)
		{
			break;
		}

		BYTE *art = new BYTE[Wads.LumpLength (lumpnum)];
		Wads.ReadLump (lumpnum, art);

		if ((numtiles = CountTiles(art)) == 0)
		{
			delete[] art;
		}
		else
		{
			BuildTileFiles.Push (art);
			totaltiles += numtiles;
		}
	}
	return totaltiles;
}